

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBaseExc.cpp
# Opt level: O0

void anon_unknown.dwarf_3441::test6<Iex_2_5::EnotcontrollerExc>(void)

{
  bool bVar1;
  __type _Var2;
  ostream *this;
  code *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  EnotcontrollerExc *this_00;
  EnotcontrollerExc *e;
  bool caught;
  EnotcontrollerExc e3;
  EnotcontrollerExc e2;
  stringstream s;
  EnotcontrollerExc e1;
  char *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  string local_2b0 [32];
  EnotcontrollerExc local_290 [72];
  string local_248 [32];
  EnotcontrollerExc local_228 [72];
  stringstream local_1e0 [16];
  ostream local_1d0 [392];
  EnotcontrollerExc local_48 [72];
  
  this = std::operator<<((ostream *)&std::cout,"6");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Iex_2_5::setStackTracer((anonymous_namespace)::getStackTrace_abi_cxx11_);
  pcVar3 = (code *)Iex_2_5::stackTracer_abi_cxx11_();
  if (pcVar3 != (anonymous_namespace)::getStackTrace_abi_cxx11_) {
    __assert_fail("IEX_INTERNAL_NAMESPACE::stackTracer() == getStackTrace",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/IexTest/testBaseExc.cpp"
                  ,0xd8,"void (anonymous namespace)::test6() [T = Iex_2_5::EnotcontrollerExc]");
  }
  Iex_2_5::EnotcontrollerExc::EnotcontrollerExc(local_48,"arg");
  Iex_2_5::BaseExc::operator+=((BaseExc *)local_48,"X");
  std::__cxx11::stringstream::stringstream(local_1e0);
  std::operator<<(local_1d0,"Y");
  Iex_2_5::BaseExc::operator+=((BaseExc *)local_48,local_1e0);
  Iex_2_5::EnotcontrollerExc::EnotcontrollerExc(local_228,local_48);
  Iex_2_5::BaseExc::message_abi_cxx11_();
  bVar1 = std::operator==(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  if (!bVar1) {
    __assert_fail("e1.message() == \"argXY\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/IexTest/testBaseExc.cpp"
                  ,0xe8,"void (anonymous namespace)::test6() [T = Iex_2_5::EnotcontrollerExc]");
  }
  Iex_2_5::BaseExc::stackTrace_abi_cxx11_();
  (anonymous_namespace)::getStackTrace_abi_cxx11_();
  _Var2 = std::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (!_Var2) {
    __assert_fail("e1.stackTrace() == getStackTrace()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/IexTest/testBaseExc.cpp"
                  ,0xe9,"void (anonymous namespace)::test6() [T = Iex_2_5::EnotcontrollerExc]");
  }
  std::__cxx11::string::~string(local_248);
  Iex_2_5::BaseExc::message_abi_cxx11_();
  Iex_2_5::BaseExc::message_abi_cxx11_();
  _Var2 = std::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (!_Var2) {
    __assert_fail("e2.message() == e1.message()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/IexTest/testBaseExc.cpp"
                  ,0xeb,"void (anonymous namespace)::test6() [T = Iex_2_5::EnotcontrollerExc]");
  }
  Iex_2_5::BaseExc::stackTrace_abi_cxx11_();
  Iex_2_5::BaseExc::stackTrace_abi_cxx11_();
  _Var2 = std::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (!_Var2) {
    __assert_fail("e2.stackTrace() == e1.stackTrace()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/IexTest/testBaseExc.cpp"
                  ,0xec,"void (anonymous namespace)::test6() [T = Iex_2_5::EnotcontrollerExc]");
  }
  Iex_2_5::BaseExc::assign((char *)local_228);
  Iex_2_5::BaseExc::message_abi_cxx11_();
  bVar1 = std::operator==(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  if (!bVar1) {
    __assert_fail("e2.message() == \"Z\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/IexTest/testBaseExc.cpp"
                  ,0xef,"void (anonymous namespace)::test6() [T = Iex_2_5::EnotcontrollerExc]");
  }
  Iex_2_5::BaseExc::assign((stringstream *)local_228);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Iex_2_5::BaseExc::message_abi_cxx11_();
  bVar1 = std::operator==(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  if (!bVar1) {
    __assert_fail("e2.message() == \"Y\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/IexTest/testBaseExc.cpp"
                  ,0xf1,"void (anonymous namespace)::test6() [T = Iex_2_5::EnotcontrollerExc]");
  }
  Iex_2_5::EnotcontrollerExc::EnotcontrollerExc(local_290,local_1e0);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Iex_2_5::BaseExc::message_abi_cxx11_();
  std::__cxx11::stringstream::str();
  _Var2 = std::operator==(__lhs,__rhs);
  if (!_Var2) {
    __assert_fail("e3.message() == s.str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/IexTest/testBaseExc.cpp"
                  ,0xf4,"void (anonymous namespace)::test6() [T = Iex_2_5::EnotcontrollerExc]");
  }
  std::__cxx11::string::~string(local_2b0);
  this_00 = (EnotcontrollerExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::EnotcontrollerExc::EnotcontrollerExc(this_00,local_48);
  __cxa_throw(this_00,&Iex_2_5::EnotcontrollerExc::typeinfo,
              Iex_2_5::EnotcontrollerExc::~EnotcontrollerExc);
}

Assistant:

void
test6()
{
    std::cout << "6" << std::endl;

    IEX_INTERNAL_NAMESPACE::setStackTracer (getStackTrace);
    assert (IEX_INTERNAL_NAMESPACE::stackTracer() == getStackTrace);
    
    //
    // Test the constructors that take char* and stringstream,
    // and the += and assign functions.
    //
    
    T e1 ("arg");

    e1 += "X";
    std::stringstream s;
    s << "Y";
    e1 += s;
    
    T e2 (e1);
    
    assert (e1.message() == "argXY");
    assert (e1.stackTrace() == getStackTrace());

    assert (e2.message() == e1.message());
    assert (e2.stackTrace() == e1.stackTrace());

    e2.assign ("Z");
    assert (e2.message() == "Z");
    e2.assign (s);
    assert (e2.message() == "Y");

    T e3 (s);
    assert (e3.message() == s.str());

    //
    // Confirm the throw/catch
    //
    
    bool caught = false;
    
    try
    {
        throw e1;
    }
    catch (T& e)
    {
        caught = true;
        assert (e.message() == e1.message());
    }
    catch (...)
    {
        assert (false);
    }

    assert (caught);
}